

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_filter.cpp
# Opt level: O2

void __thiscall CServerFilterInfo::Set(CServerFilterInfo *this,CServerFilterInfo *pSrc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int i;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  iVar1 = pSrc->m_Ping;
  iVar2 = pSrc->m_Country;
  iVar3 = pSrc->m_ServerLevel;
  this->m_SortHash = pSrc->m_SortHash;
  this->m_Ping = iVar1;
  this->m_Country = iVar2;
  this->m_ServerLevel = iVar3;
  lVar4 = 0;
  for (lVar5 = -0x80; lVar5 != 0; lVar5 = lVar5 + 0x10) {
    str_copy(this->m_aGametypeExclusive + lVar5,pSrc->m_aGametypeExclusive + lVar5,0x10);
    if (this->m_aGametypeExclusive[lVar5] == '\0') {
      bVar6 = false;
    }
    else {
      bVar6 = pSrc->m_aGametypeExclusive[lVar4] != '\0';
    }
    this->m_aGametypeExclusive[lVar4] = bVar6;
    lVar4 = lVar4 + 1;
  }
  str_copy(this->m_aAddress,pSrc->m_aAddress,0x30);
  return;
}

Assistant:

void CServerFilterInfo::Set(const CServerFilterInfo *pSrc)
{
	m_SortHash = pSrc->m_SortHash;
	m_Ping = pSrc->m_Ping;
	m_Country = pSrc->m_Country;
	m_ServerLevel = pSrc->m_ServerLevel;
	for(int i = 0; i < CServerFilterInfo::MAX_GAMETYPES; ++i)
	{
		str_copy(m_aGametype[i], pSrc->m_aGametype[i], sizeof(m_aGametype[i]));
		m_aGametypeExclusive[i] = m_aGametype[i][0] && pSrc->m_aGametypeExclusive[i];
	}
	str_copy(m_aAddress, pSrc->m_aAddress, sizeof(m_aAddress));
}